

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O0

void jpeg_suppress_tables(j_compress_ptr cinfo,boolean suppress)

{
  JHUFF_TBL *htbl;
  JQUANT_TBL *qtbl;
  int i;
  boolean suppress_local;
  j_compress_ptr cinfo_local;
  
  for (i = 0; i < 4; i = i + 1) {
    if (cinfo->quant_tbl_ptrs[i] != (JQUANT_TBL *)0x0) {
      cinfo->quant_tbl_ptrs[i]->sent_table = suppress;
    }
  }
  for (i = 0; i < 4; i = i + 1) {
    if (cinfo->dc_huff_tbl_ptrs[i] != (JHUFF_TBL *)0x0) {
      cinfo->dc_huff_tbl_ptrs[i]->sent_table = suppress;
    }
    if (cinfo->ac_huff_tbl_ptrs[i] != (JHUFF_TBL *)0x0) {
      cinfo->ac_huff_tbl_ptrs[i]->sent_table = suppress;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_suppress_tables (j_compress_ptr cinfo, boolean suppress)
{
  int i;
  JQUANT_TBL * qtbl;
  JHUFF_TBL * htbl;

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    if ((qtbl = cinfo->quant_tbl_ptrs[i]) != NULL)
      qtbl->sent_table = suppress;
  }

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    if ((htbl = cinfo->dc_huff_tbl_ptrs[i]) != NULL)
      htbl->sent_table = suppress;
    if ((htbl = cinfo->ac_huff_tbl_ptrs[i]) != NULL)
      htbl->sent_table = suppress;
  }
}